

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmListFileBacktrace * __thiscall
cmMakefile::GetBacktrace(cmListFileBacktrace *__return_storage_ptr__,cmMakefile *this)

{
  cmLinkedTree<cmState::SnapshotDataType> *pcVar1;
  __normal_iterator<const_cmMakefile::CallStackEntry_*,_std::vector<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>_>
  __tmp;
  pointer pCVar2;
  
  (__return_storage_ptr__->Snapshot).Position.Position = (this->StateSnapshot).Position.Position;
  pcVar1 = (this->StateSnapshot).Position.Tree;
  (__return_storage_ptr__->Snapshot).State = (this->StateSnapshot).State;
  (__return_storage_ptr__->Snapshot).Position.Tree = pcVar1;
  (__return_storage_ptr__->super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>).
  super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>).
  super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>).
  super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (pCVar2 = (this->CallStack).
                super__Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pCVar2 != (this->CallStack).
                super__Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>
                ._M_impl.super__Vector_impl_data._M_start; pCVar2 = pCVar2 + -1) {
    cmListFileBacktrace::Append(__return_storage_ptr__,pCVar2[-1].Context);
  }
  return __return_storage_ptr__;
}

Assistant:

cmListFileBacktrace cmMakefile::GetBacktrace() const
{
  cmListFileBacktrace backtrace(this->StateSnapshot);
  for(CallStackType::const_reverse_iterator i = this->CallStack.rbegin();
      i != this->CallStack.rend(); ++i)
    {
    backtrace.Append(*i->Context);
    }
  return backtrace;
}